

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

vm_obj_id_t CVmObjFileName::create_from_stack(uchar **pc_ptr,uint argc)

{
  vm_obj_id_t vVar1;
  int iVar2;
  int32_t sfid;
  ushort *puVar3;
  size_t len;
  size_t len_00;
  ushort *puVar4;
  char buf [4096];
  char acStack_1028 [4104];
  
  if (argc == 2) {
    puVar3 = (ushort *)get_local_path(sp_ + -1);
    if ((puVar3 == (ushort *)0x0) ||
       (puVar4 = (ushort *)get_local_path(sp_ + -2), puVar4 == (ushort *)0x0)) goto LAB_002549db;
    vVar1 = combine_path((char *)(puVar3 + 1),(ulong)*puVar3,(char *)(puVar4 + 1),(ulong)*puVar4,0);
  }
  else {
    if (argc == 1) {
      puVar3 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
      if (puVar3 == (ushort *)0x0) {
        if ((sp_[-1].typ == VM_INT) || (iVar2 = vm_val_t::nonint_is_numeric(sp_ + -1), iVar2 != 0))
        {
          if (sp_[-1].typ == VM_INT) {
            sfid = sp_[-1].val.intval;
          }
          else {
            sfid = vm_val_t::nonint_num_to_int(sp_ + -1);
          }
          iVar2 = CVmObjFile::sfid_to_path(acStack_1028,0x1000,sfid);
          if (iVar2 == 0) {
            err_throw(0x902);
          }
          len = strlen(acStack_1028);
          vVar1 = create_from_sfid(sfid,acStack_1028,len);
          goto LAB_002549bc;
        }
        goto LAB_002549db;
      }
      puVar4 = puVar3 + 1;
      len_00 = (size_t)*puVar3;
    }
    else {
      if (argc != 0) {
LAB_002549db:
        if (2 < argc) {
          err_throw(0x899);
        }
        err_throw(0x900);
      }
      CVmNetFile::is_net_mode();
      puVar4 = (ushort *)0x2a7fb2;
      len_00 = 1;
    }
    vVar1 = create_from_local((char *)puVar4,len_00);
  }
LAB_002549bc:
  sp_ = sp_ + -(long)(int)argc;
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjFileName::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    /* parse arguments */
    const char *path, *file;
    vm_obj_id_t id = VM_INVALID_OBJ;
    if (argc == 0)
    {
        /* no arguments - create a file representing the working directory */
        const char *pwd = fn_pwd_dir(vmg0_);
        id = create_from_local(vmg_ pwd, strlen(pwd));
    }
    else if (argc == 1 && (file = G_stk->get(0)->get_as_string(vmg0_)) != 0)
    {
        /* it's a string in local filename notation */
        id = create_from_local(vmg_ file + VMB_LEN, vmb_get_len(file));
    }
    else if (argc == 1 && G_stk->get(0)->is_numeric(vmg0_))
    {
        /* it's a special file ID - resolve to a path */
        int32_t sfid = G_stk->get(0)->num_to_int(vmg0_);
        char buf[OSFNMAX];
        if (!CVmObjFile::sfid_to_path(vmg_ buf, sizeof(buf), sfid))
            err_throw(VMERR_BAD_VAL_BIF);

        /* create the file */
        id = create_from_sfid(vmg_ sfid, buf, strlen(buf));
    }
    else if (argc == 2
             && (path = get_local_path(vmg_ G_stk->get(0))) != 0
             && (file = get_local_path(vmg_ G_stk->get(1))) != 0)
    {
        /* create a FileName from the combination of the two path strings */
        id = combine_path(vmg_ path + VMB_LEN, vmb_get_len(path),
                          file + VMB_LEN, vmb_get_len(file), FALSE);
    }
    else if (argc >= 3)
    {
        /* invalid number of arguments */
        err_throw(VMERR_WRONG_NUM_OF_ARGS);
    }
    else
    {
        /* wrong types */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new ID */
    return id;
}